

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * __thiscall
Util::join<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
          (string *__return_storage_ptr__,Util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char **ts_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2)

{
  ostringstream stream;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,*(char **)this,*(long *)(this + 8));
  inner::join_helper<char_const*,std::__cxx11::string_const&>
            ((ostringstream *)local_1a0,(char **)ts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	std::ostringstream stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}